

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

LookupParameters * __thiscall cnn::Model::add_lookup_parameters(Model *this,uint n,Dim *d)

{
  LookupParameters *this_00;
  value_type *in_RDI;
  LookupParameters *p;
  Dim *in_stack_00000050;
  uint in_stack_0000005c;
  LookupParameters *in_stack_00000060;
  LookupParameters *__x;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
  *in_stack_ffffffffffffffd0;
  
  this_00 = (LookupParameters *)operator_new(0x98);
  LookupParameters::LookupParameters(in_stack_00000060,in_stack_0000005c,in_stack_00000050);
  __x = this_00;
  std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::push_back
            ((vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)this_00,in_RDI
            );
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::push_back
            (in_stack_ffffffffffffffd0,(value_type *)__x);
  return this_00;
}

Assistant:

LookupParameters* Model::add_lookup_parameters(unsigned n, const Dim& d) {
  LookupParameters* p = new LookupParameters(n,d);
  all_params.push_back(p);
  lookup_params.push_back(p);
  return p;
}